

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.h
# Opt level: O1

iterator __thiscall
fmt::v6::formatter<std::vector<int,std::allocator<int>>,char,void>::
format<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
          (formatter<std::vector<int,std::allocator<int>>,char,void> *this,
          vector<int,_std::allocator<int>_> *values,
          basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
          *ctx)

{
  formatter<std::vector<int,std::allocator<int>>,char,void> fVar1;
  buffer<char> *pbVar2;
  size_t sVar3;
  pointer piVar4;
  pointer piVar5;
  undefined1 auVar6 [16];
  long lVar7;
  size_t sVar8;
  long lVar9;
  char *__s;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  ulong local_68 [2];
  undefined **local_58 [2];
  size_t local_48;
  size_t local_40;
  buffer<char> *local_38;
  
  fVar1 = *this;
  pbVar2 = (ctx->out_).container;
  if (pbVar2->capacity_ < pbVar2->size_ + 1) {
    (**pbVar2->_vptr_buffer)(pbVar2);
  }
  sVar3 = pbVar2->size_;
  pbVar2->size_ = sVar3 + 1;
  *(formatter<std::vector<int,std::allocator<int>>,char,void> *)(pbVar2->ptr_ + sVar3) = fVar1;
  piVar4 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar4 != piVar5) {
    lVar9 = 0;
    do {
      __s = "{}";
      if (lVar9 != 0) {
        fVar1 = this[1];
        if (pbVar2->capacity_ < pbVar2->size_ + 1) {
          (**pbVar2->_vptr_buffer)(pbVar2);
        }
        sVar3 = pbVar2->size_;
        pbVar2->size_ = sVar3 + 1;
        *(formatter<std::vector<int,std::allocator<int>>,char,void> *)(pbVar2->ptr_ + sVar3) = fVar1
        ;
        __s = " {}";
      }
      sVar8 = strlen(__s);
      local_68[0] = (ulong)*(uint *)((long)piVar4 + lVar9);
      local_48 = pbVar2->size_;
      local_58[0] = &PTR_grow_0018b2c8;
      format_str.size_ = sVar8;
      format_str.data_ = __s;
      args.field_1.values_ =
           (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            *)local_68;
      args.types_ = 2;
      local_40 = local_48;
      local_38 = pbVar2;
      vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                ((range)local_58,format_str,args,(locale_ref)0x0);
      if (lVar9 == 0x400) {
        local_68[0] = 0;
        local_48 = pbVar2->size_;
        local_58[0] = &PTR_grow_0018b2c8;
        format_str_00.size_ = 0x15;
        format_str_00.data_ = " ... <other elements>";
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_68;
        local_40 = local_48;
        local_38 = pbVar2;
        vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                  ((range)local_58,format_str_00,
                   (basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                    )(auVar6 << 0x40),(locale_ref)0x0);
        break;
      }
      lVar7 = lVar9 + 4;
      lVar9 = lVar9 + 4;
    } while ((pointer)((long)piVar4 + lVar7) != piVar5);
  }
  fVar1 = this[2];
  if (pbVar2->capacity_ < pbVar2->size_ + 1) {
    (**pbVar2->_vptr_buffer)(pbVar2);
  }
  sVar3 = pbVar2->size_;
  pbVar2->size_ = sVar3 + 1;
  *(formatter<std::vector<int,std::allocator<int>>,char,void> *)(pbVar2->ptr_ + sVar3) = fVar1;
  return (iterator)pbVar2;
}

Assistant:

typename FormatContext::iterator format(const RangeT& values,
                                          FormatContext& ctx) {
    auto out = internal::copy(formatting.prefix, ctx.out());
    std::size_t i = 0;
    for (auto it = values.begin(), end = values.end(); it != end; ++it) {
      if (i > 0) {
        if (formatting.add_prepostfix_space) *out++ = ' ';
        out = internal::copy(formatting.delimiter, out);
      }
      out = format_to(out,
                      internal::format_str_quoted(
                          (formatting.add_delimiter_spaces && i > 0), *it),
                      *it);
      if (++i > formatting.range_length_limit) {
        out = format_to(out, " ... <other elements>");
        break;
      }
    }
    if (formatting.add_prepostfix_space) *out++ = ' ';
    return internal::copy(formatting.postfix, out);
  }